

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_6acc::VECTOR_FLATTEN_DIM_2_Test::TestBody(VECTOR_FLATTEN_DIM_2_Test *this)

{
  allocator<int> *this_00;
  allocator<std::vector<int,_std::allocator<int>_>_> *this_01;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_01;
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  vector<int,_std::allocator<int>_> *local_1f0;
  AssertHelper local_1c0;
  Message local_1b8;
  int local_1ac;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_4;
  Message local_190;
  int local_184;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_3;
  Message local_168;
  int local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_2;
  Message local_140;
  int local_134;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_1;
  Message local_118;
  int local_10c;
  size_type local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar;
  undefined1 local_d8 [8];
  vector<int,_std::allocator<int>_> res;
  int local_b8 [2];
  iterator local_b0;
  size_type local_a8;
  allocator<int> local_8d;
  int local_8c [3];
  iterator local_80;
  size_type local_78;
  vector<int,_std::allocator<int>_> *local_70;
  vector<int,_std::allocator<int>_> local_68;
  vector<int,_std::allocator<int>_> local_50;
  undefined1 local_38 [24];
  type v;
  VECTOR_FLATTEN_DIM_2_Test *this_local;
  
  res.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 1;
  local_8c[0] = 1;
  local_8c[1] = 2;
  local_8c[2] = 3;
  local_80 = local_8c;
  local_78 = 3;
  local_70 = &local_68;
  v.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<int>::allocator(&local_8d);
  __l_00._M_len = local_78;
  __l_00._M_array = local_80;
  std::vector<int,_std::allocator<int>_>::vector(&local_68,__l_00,&local_8d);
  local_b8[0] = 4;
  local_b8[1] = 5;
  local_b0 = local_b8;
  local_a8 = 2;
  this_00 = (allocator<int> *)
            ((long)&res.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  local_70 = &local_50;
  std::allocator<int>::allocator(this_00);
  __l._M_len = local_a8;
  __l._M_array = local_b0;
  std::vector<int,_std::allocator<int>_>::vector(&local_50,__l,this_00);
  res.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 0;
  local_38._0_8_ = &local_68;
  local_38._8_8_ = (pointer)0x2;
  this_01 = (allocator<std::vector<int,_std::allocator<int>_>_> *)
            ((long)&res.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(this_01);
  __l_01._M_len = local_38._8_8_;
  __l_01._M_array = (iterator)local_38._0_8_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)(local_38 + 0x10),__l_01,this_01);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)
             ((long)&res.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 5));
  local_1f0 = (vector<int,_std::allocator<int>_> *)local_38;
  do {
    local_1f0 = local_1f0 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(local_1f0);
  } while (local_1f0 != &local_68);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&res.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<int>::~allocator(&local_8d);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&gtest_ar.message_,
           (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)(local_38 + 0x10));
  dnet::data_types::vec_flater<int,_2U>::flatten
            ((output_type *)local_d8,(input_type *)&gtest_ar.message_);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&gtest_ar.message_);
  local_108 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_d8);
  local_10c = 5;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_100,"res.size()","5",&local_108,&local_10c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_d8,0);
  local_134 = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_130,"res[0]","1",pvVar3,&local_134);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x2a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_d8,1);
  local_15c = 2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_158,"res[1]","2",pvVar3,&local_15c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_d8,3);
  local_184 = 4;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_180,"res[3]","4",pvVar3,&local_184);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_d8,4);
  local_1ac = 5;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_1a8,"res[4]","5",pvVar3,&local_1ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_d8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)(local_38 + 0x10));
  return;
}

Assistant:

TEST(VECTOR_FLATTEN, DIM_2) {
        vector_dim<int, 2>::type v = {{1,2,3}, {4,5}};
        vector<int> res = vec_flater<int, 2>::flatten(v);
        EXPECT_EQ(res.size(), 5);
        EXPECT_EQ(res[0], 1);
        EXPECT_EQ(res[1], 2);
        EXPECT_EQ(res[3], 4);
        EXPECT_EQ(res[4], 5);
    }